

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O1

void __thiscall MxxSort_SampleSort1_Test::~MxxSort_SampleSort1_Test(MxxSort_SampleSort1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxSort, SampleSort1) {
    mxx::comm c;
    // simple sorting test with same number of elements for each processor
    std::vector<int> vec(230);
    srand(c.rank());
    std::generate(vec.begin(), vec.end(), std::rand);

    // sort
    mxx::sort(vec.begin(), vec.end(), std::less<int>(), c);

    // should be locally sorted
    ASSERT_TRUE(std::is_sorted(vec.begin(), vec.end()));

    // first element on each proc should be larger or equal to last one on
    // previous processor
    int prev = mxx::right_shift(vec.back(), c);
    if (c.rank() > 0) {
        ASSERT_TRUE(prev <= vec.front());
    }

    // assume is sorted
    bool sorted = mxx::is_sorted(vec.begin(), vec.end(), std::less<int>(), c);
    ASSERT_EQ(true, sorted);

}